

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_zenobian.cxx
# Opt level: O0

void __thiscall xray_re::se_turret_mgun::se_turret_mgun(se_turret_mgun *this)

{
  se_turret_mgun *this_local;
  
  cse_alife_helicopter::cse_alife_helicopter(&this->super_cse_alife_helicopter);
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.
  super_cse_alife_dynamic_object.super_cse_alife_object.super_cse_abstract._vptr_cse_abstract =
       (_func_int **)&PTR__se_turret_mgun_00390f80;
  (this->super_cse_alife_helicopter).super_cse_alife_dynamic_object_visual.super_cse_visual.
  _vptr_cse_visual = (_func_int **)&PTR__se_turret_mgun_00390fe8;
  (this->super_cse_alife_helicopter).super_cse_motion._vptr_cse_motion =
       (_func_int **)&PTR__se_turret_mgun_00391010;
  (this->super_cse_alife_helicopter).super_cse_ph_skeleton._vptr_cse_ph_skeleton =
       (_func_int **)&PTR__se_turret_mgun_00391038;
  this->m_health = 0.0;
  return;
}

Assistant:

se_turret_mgun::se_turret_mgun(): m_health(0) {}